

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt5a.cpp
# Opt level: O0

void __thiscall
crnlib::dxt5_endpoint_optimizer::evaluate_solution
          (dxt5_endpoint_optimizer *this,uint low_endpoint,uint high_endpoint)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  uint *puVar6;
  uchar *puVar7;
  uint local_68;
  int selector_error;
  uint j;
  uint best_selector;
  uint best_selector_error;
  uint weight;
  uint val;
  uint i;
  uint64 trial_error;
  uint selector_values [8];
  uint local_1c;
  uint block_type;
  uint high_endpoint_local;
  uint low_endpoint_local;
  dxt5_endpoint_optimizer *this_local;
  
  local_1c = 0;
  do {
    uVar4 = 1;
    if ((this->m_pParams->m_use_both_block_types & 1U) != 0) {
      uVar4 = 2;
    }
    if (uVar4 <= local_1c) {
      return;
    }
    if (local_1c == 0) {
      dxt5_block::get_block_values8((uint *)&trial_error,low_endpoint,high_endpoint);
    }
    else {
      dxt5_block::get_block_values6((uint *)&trial_error,low_endpoint,high_endpoint);
    }
    _val = 0;
    for (weight = 0; uVar3 = vector<unsigned_char>::size(&this->m_unique_values), weight < uVar3;
        weight = weight + 1) {
      pbVar5 = vector<unsigned_char>::operator[](&this->m_unique_values,weight);
      bVar1 = *pbVar5;
      puVar6 = vector<unsigned_int>::operator[](&this->m_unique_value_weights,weight);
      j = 0xffffffff;
      selector_error = 0;
      for (local_68 = 0; local_68 < 8; local_68 = local_68 + 1) {
        uVar4 = ((uint)bVar1 - selector_values[(ulong)local_68 - 2]) *
                ((uint)bVar1 - selector_values[(ulong)local_68 - 2]) * *puVar6;
        iVar2 = selector_error;
        if (uVar4 < j) {
          selector_error = local_68;
          iVar2 = selector_error;
          selector_error._0_1_ = (uchar)local_68;
          j = uVar4;
          if (uVar4 == 0) break;
        }
        selector_error = iVar2;
      }
      puVar7 = vector<unsigned_char>::operator[](&this->m_trial_selectors,weight);
      *puVar7 = (uchar)selector_error;
      _val = j + _val;
      if (this->m_pResults->m_error < _val) break;
    }
    if (_val < this->m_pResults->m_error) {
      this->m_pResults->m_error = _val;
      this->m_pResults->m_first_endpoint = (uint8)low_endpoint;
      this->m_pResults->m_second_endpoint = (uint8)high_endpoint;
      this->m_pResults->m_block_type = (uint8)local_1c;
      vector<unsigned_char>::swap(&this->m_best_selectors,&this->m_trial_selectors);
      if (_val == 0) {
        return;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

void dxt5_endpoint_optimizer::evaluate_solution(uint low_endpoint, uint high_endpoint)
    {
        for (uint block_type = 0; block_type < (m_pParams->m_use_both_block_types ? 2U : 1U); block_type++)
        {
            uint selector_values[8];

            if (!block_type)
            {
                dxt5_block::get_block_values8(selector_values, low_endpoint, high_endpoint);
            }
            else
            {
                dxt5_block::get_block_values6(selector_values, low_endpoint, high_endpoint);
            }

            uint64 trial_error = 0;

            for (uint i = 0; i < m_unique_values.size(); i++)
            {
                const uint val = m_unique_values[i];
                const uint weight = m_unique_value_weights[i];

                uint best_selector_error = UINT_MAX;
                uint best_selector = 0;

                for (uint j = 0; j < 8; j++)
                {
                    int selector_error = val - selector_values[j];
                    selector_error = selector_error * selector_error * (int)weight;

                    if (static_cast<uint>(selector_error) < best_selector_error)
                    {
                        best_selector_error = selector_error;
                        best_selector = j;
                        if (!best_selector_error)
                        {
                            break;
                        }
                    }
                }

                m_trial_selectors[i] = static_cast<uint8>(best_selector);
                trial_error += best_selector_error;

                if (trial_error > m_pResults->m_error)
                {
                    break;
                }
            }

            if (trial_error < m_pResults->m_error)
            {
                m_pResults->m_error = trial_error;
                m_pResults->m_first_endpoint = static_cast<uint8>(low_endpoint);
                m_pResults->m_second_endpoint = static_cast<uint8>(high_endpoint);
                m_pResults->m_block_type = static_cast<uint8>(block_type);
                m_best_selectors.swap(m_trial_selectors);

                if (!trial_error)
                {
                    break;
                }
            }
        }
    }